

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

QByteArray * cleaned(QByteArray *input)

{
  char *pcVar1;
  qsizetype qVar2;
  char *pcVar3;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  bool bVar4;
  char ch;
  bool takeLine;
  int newlines;
  char *output;
  char *end;
  char *data;
  QByteArray *result;
  QByteArray *in_stack_ffffffffffffffa0;
  bool local_52;
  bool local_51;
  char local_36;
  int local_34;
  char *local_30;
  char *local_20;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x16b2b5);
  QByteArray::size(in_RSI);
  QByteArray::resize((longlong)in_RDI);
  local_20 = QByteArray::constData((QByteArray *)0x16b2d6);
  pcVar1 = QByteArray::constData((QByteArray *)0x16b2e5);
  qVar2 = QByteArray::size(in_RSI);
  pcVar1 = pcVar1 + qVar2;
  local_30 = QByteArray::data(in_stack_ffffffffffffffa0);
  local_34 = 0;
LAB_0016b31b:
  do {
    if (local_20 == pcVar1) {
      QByteArray::constData((QByteArray *)0x16b595);
      QByteArray::resize((longlong)in_RDI);
      return in_RDI;
    }
    while( true ) {
      local_51 = false;
      if (local_20 != pcVar1) {
        local_51 = is_space(*local_20);
      }
      if (local_51 == false) break;
      local_20 = local_20 + 1;
    }
    bVar4 = *local_20 == '#';
    if ((*local_20 == '%') && (local_20[1] == ':')) {
      bVar4 = true;
      local_20 = local_20 + 1;
    }
    pcVar3 = local_20;
    if (bVar4) {
      *local_30 = '#';
      local_30 = local_30 + 1;
      do {
        local_20 = local_20 + 1;
        local_52 = false;
        if (local_20 != pcVar1) {
          local_52 = is_space(*local_20);
        }
        pcVar3 = local_20;
      } while (local_52 != false);
    }
    while (local_20 = pcVar3, local_20 != pcVar1) {
      if (*local_20 == '\\') {
        if (local_20[1] == '\r') {
          local_20 = local_20 + 1;
        }
        if ((local_20 == pcVar1) || ((local_20[1] != '\n' && (*local_20 != '\r'))))
        goto LAB_0016b4dc;
        local_34 = local_34 + 1;
        pcVar3 = local_20 + 1;
        if ((pcVar3 != pcVar1) && (*pcVar3 != '\r')) {
          pcVar3 = local_20 + 2;
        }
      }
      else {
        if ((*local_20 == '\r') && (local_20[1] == '\n')) {
          local_20 = local_20 + 1;
        }
LAB_0016b4dc:
        if (local_20 == pcVar1) break;
        local_36 = *local_20;
        if (local_36 == '\r') {
          local_36 = '\n';
        }
        *local_30 = local_36;
        local_30 = local_30 + 1;
        if (*local_20 == '\n') goto LAB_0016b52f;
        pcVar3 = local_20 + 1;
      }
    }
  } while( true );
LAB_0016b52f:
  for (; local_34 != 0; local_34 = local_34 + -1) {
    *local_30 = '\n';
    local_30 = local_30 + 1;
  }
  local_20 = local_20 + 1;
  goto LAB_0016b31b;
}

Assistant:

static QByteArray cleaned(const QByteArray &input)
{
    QByteArray result;
    result.resize(input.size());
    const char *data = input.constData();
    const char *end = input.constData() + input.size();
    char *output = result.data();

    int newlines = 0;
    while (data != end) {
        while (data != end && is_space(*data))
            ++data;
        bool takeLine = (*data == '#');
        if (*data == '%' && *(data+1) == ':') {
            takeLine = true;
            ++data;
        }
        if (takeLine) {
            *output = '#';
            ++output;
            do ++data; while (data != end && is_space(*data));
        }
        while (data != end) {
            // handle \\\n, \\\r\n and \\\r
            if (*data == '\\') {
                if (*(data + 1) == '\r') {
                    ++data;
                }
                if (data != end && (*(data + 1) == '\n' || (*data) == '\r')) {
                    ++newlines;
                    data += 1;
                    if (data != end && *data != '\r')
                        data += 1;
                    continue;
                }
            } else if (*data == '\r' && *(data + 1) == '\n') { // reduce \r\n to \n
                ++data;
            }
            if (data == end)
                break;

            char ch = *data;
            if (ch == '\r') // os9: replace \r with \n
                ch = '\n';
            *output = ch;
            ++output;

            if (*data == '\n') {
                // output additional newlines to keep the correct line-numbering
                // for the lines following the backslash-newline sequence(s)
                while (newlines) {
                    *output = '\n';
                    ++output;
                    --newlines;
                }
                ++data;
                break;
            }
            ++data;
        }
    }
    result.resize(output - result.constData());
    return result;
}